

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

void __thiscall
CETime::CETime(CETime *this,vector<double,_std::allocator<double>_> *time,CETimeType time_format)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  undefined4 in_EDX;
  CETime *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  ulong local_30;
  CETime *this_00;
  
  *in_RDI = &PTR__CETime_0017bd18;
  this_00 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x167509);
  init_members(this_00);
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)in_RSI);
    if (sVar2 <= local_30) {
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_RSI,local_30);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),local_30);
    *pvVar3 = vVar1;
    if (local_30 == 3) break;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

CETime::CETime(std::vector<double> time, CETimeType time_format)
{
    init_members();
    time_type_ = time_format;
    // Just in case the passed "time" variable isnt the same length
    for (size_t i=0; i<time.size(); i++) {
        time_[i] = time[i] ;
        // In case "time" has more than 4 elements,
        // quit when we've stored the first 4
        if (i==3) break ;
    }
}